

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

Pass * wasm::createDAEPass(void)

{
  DAE *this;
  
  this = (DAE *)operator_new(0x70);
  (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
  (this->super_Pass).runner = (PassRunner *)0x0;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)0x0;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->super_Pass).name.field_2 + 8) = 0;
  *(undefined8 *)&this->optimize = 0;
  (this->allDroppedCalls)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->allDroppedCalls)._M_h._M_bucket_count = 0;
  (this->allDroppedCalls)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->allDroppedCalls)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->allDroppedCalls)._M_h._M_rehash_policy = 0;
  (this->allDroppedCalls)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->allDroppedCalls)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  DAE::DAE(this);
  return &this->super_Pass;
}

Assistant:

Pass* createDAEPass() { return new DAE(); }